

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O1

void duckdb::MarkJoinComparisonSwitch
               (Vector *left,Vector *right,idx_t lcount,idx_t rcount,bool *found_match,
               ExpressionType comparison_type)

{
  PhysicalType PVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  InternalException *this;
  NotImplementedException *pNVar8;
  int iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  bool bVar15;
  bool bVar16;
  UnifiedVectorFormat right_data;
  Vector left_reference;
  undefined1 local_108 [16];
  SelectionVector local_f8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  data_ptr_t local_58;
  SelectionVector *local_50;
  LogicalType local_48;
  
  uVar4 = (uint)(left->type).physical_type_;
  if ((uVar4 < 0x1e) && ((0x21800000U >> (uVar4 & 0x1f) & 1) != 0)) {
    LogicalType::LogicalType(&local_48,&left->type);
    Vector::Vector((Vector *)local_c0,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
    if (lcount != 0) {
      iVar10 = 0;
      do {
        if (found_match[iVar10] == false) {
          ConstantVector::Reference((Vector *)local_c0,left,iVar10,rcount);
          switch(comparison_type) {
          case COMPARE_BOUNDARY_START:
            iVar5 = VectorOperations::Equals
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_NOTEQUAL:
            iVar5 = VectorOperations::NotEquals
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_LESSTHAN:
            iVar5 = VectorOperations::LessThan
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_GREATERTHAN:
            iVar5 = VectorOperations::GreaterThan
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_LESSTHANOREQUALTO:
            iVar5 = VectorOperations::LessThanEquals
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          case COMPARE_GREATERTHANOREQUALTO:
            iVar5 = VectorOperations::GreaterThanEquals
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::ValidityMask,_true>)0x0);
            break;
          default:
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_108._0_8_ = local_f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"Unsupported comparison type for MarkJoinNested","");
            InternalException::InternalException(this,(string *)local_108);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          case COMPARE_DISTINCT_FROM:
            iVar5 = VectorOperations::DistinctFrom
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0);
            break;
          case COMPARE_BOUNDARY_END:
            iVar5 = VectorOperations::NotDistinctFrom
                              ((Vector *)local_c0,right,
                               (optional_ptr<const_duckdb::SelectionVector,_true>)0x0,rcount,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                               (optional_ptr<duckdb::SelectionVector,_true>)0x0);
          }
          if (iVar5 != 0) {
            found_match[iVar10] = true;
          }
        }
        iVar10 = iVar10 + 1;
      } while (lcount != iVar10);
    }
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
    }
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)local_b8);
  }
  else {
    switch(comparison_type) {
    case COMPARE_BOUNDARY_START:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e28b5;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e28b5:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(data_ptr_t)(local_b8._0_8_ + uVar7) ==
                          *(data_t *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7cea;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7cea:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(data_ptr_t)(local_b8._0_8_ + uVar7) ==
                          *(data_t *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e59f6;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e59f6:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) ==
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7f40;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7f40:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) ==
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7395;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7395:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) ==
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6dbc;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6dbc:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) ==
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4f3f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4f3f:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) ==
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7e15;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7e15:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) ==
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e27f6_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5064;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5064:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = Equals::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + uVar6 * 4));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5409;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5409:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = Equals::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + uVar6 * 8));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e93d6;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e93d6:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::operator==
                                       ((string_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (string_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8ed6;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8ed6:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator==
                                       ((uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e27f6_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e3990;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e3990:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    iVar9 = 0;
                    if ((*(long *)(local_b8._0_8_ + uVar7 * 0x10) ==
                         *(long *)(local_108._8_8_ + uVar6 * 0x10)) &&
                       (((long *)(local_b8._0_8_ + uVar7 * 0x10))[1] ==
                        *(long *)(local_108._8_8_ + uVar6 * 0x10 + 8))) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    case COMPARE_NOTEQUAL:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e2b61;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e2b61:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(data_ptr_t)(local_b8._0_8_ + uVar7) !=
                          *(data_t *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e66c1;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e66c1:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(data_ptr_t)(local_b8._0_8_ + uVar7) !=
                          *(data_t *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e46ea;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e46ea:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) !=
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6917;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6917:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) !=
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5c4e;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5c4e:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) !=
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5b23;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5b23:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) !=
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e3e8b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e3e8b:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) !=
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e67ec;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e67ec:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) !=
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e2aa2_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e3fb0;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e3fb0:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = Equals::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + uVar6 * 4));
                      iVar9 = 0;
                      if (!bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4349;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4349:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = Equals::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + uVar6 * 8));
                      iVar9 = 0;
                      if (!bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8b16;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8b16:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::operator==
                                       ((string_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (string_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8756;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8756:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator==
                                       ((uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e2aa2_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e339a;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e339a:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    if ((*(long *)(local_b8._0_8_ + uVar7 * 0x10) !=
                         *(long *)(local_108._8_8_ + uVar6 * 0x10)) ||
                       (iVar9 = 0,
                       ((long *)(local_b8._0_8_ + uVar7 * 0x10))[1] !=
                       *(long *)(local_108._8_8_ + uVar6 * 0x10 + 8))) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    case COMPARE_LESSTHAN:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e2e0d;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e2e0d:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if ((char)*(data_ptr_t)(local_b8._0_8_ + uVar7) <
                          (char)*(data_ptr_t)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e75e4;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e75e4:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(byte *)(local_b8._0_8_ + uVar7) < *(byte *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5546;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5546:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ushort *)(local_b8._0_8_ + uVar7 * 2) <
                          *(ushort *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e783a;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e783a:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) <
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6a44;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6a44:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(uint *)(local_b8._0_8_ + uVar7 * 4) <
                          *(uint *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6596;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6596:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) <
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e494e;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e494e:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ulong *)(local_b8._0_8_ + uVar7 * 8) <
                          *(ulong *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e770f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e770f:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) <
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e2d4e_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4a73;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4a73:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<float>
                                         ((float *)(local_108._8_8_ + uVar6 * 4),
                                          (float *)(local_b8._0_8_ + uVar7 * 4));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e519b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e519b:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<double>
                                         ((double *)(local_108._8_8_ + uVar6 * 8),
                                          (double *)(local_b8._0_8_ + uVar7 * 8));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e9156;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e9156:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::StringComparisonOperators::GreaterThan
                                       ((string_t *)(local_108._8_8_ + uVar7 * 0x10),
                                        (string_t *)(local_b8._0_8_ + iVar5 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8c56;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8c56:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator>
                                       ((uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10),
                                        (uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e2d4e_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e3690;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e3690:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    uVar3 = ((ulong *)(local_b8._0_8_ + uVar7 * 0x10))[1];
                    if (((long)uVar3 < (long)*(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8)) ||
                       (iVar9 = 0,
                       *(ulong *)(local_b8._0_8_ + uVar7 * 0x10) <
                       *(ulong *)(local_108._8_8_ + uVar6 * 0x10) &&
                       *(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8) == uVar3)) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    case COMPARE_GREATERTHAN:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e2f63;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e2f63:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if ((char)*(data_ptr_t)(local_108._8_8_ + uVar6) <
                          (char)*(data_ptr_t)(local_b8._0_8_ + uVar7)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7967;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7967:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(byte *)(local_108._8_8_ + uVar6) < *(byte *)(local_b8._0_8_ + uVar7)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e579e;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e579e:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ushort *)(local_108._8_8_ + uVar6 * 2) <
                          *(ushort *)(local_b8._0_8_ + uVar7 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7bbd;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7bbd:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_108._8_8_ + uVar6 * 2) <
                          *(short *)(local_b8._0_8_ + uVar7 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6ee7;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6ee7:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(uint *)(local_108._8_8_ + uVar6 * 4) <
                          *(uint *)(local_b8._0_8_ + uVar7 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6b6f;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6b6f:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_108._8_8_ + uVar6 * 4) <
                          *(int *)(local_b8._0_8_ + uVar7 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4cdd;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4cdd:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ulong *)(local_108._8_8_ + uVar6 * 8) <
                          *(ulong *)(local_b8._0_8_ + uVar7 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7a92;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7a92:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_108._8_8_ + uVar6 * 8) <
                          *(long *)(local_b8._0_8_ + uVar7 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e2ea4_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4e02;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4e02:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + uVar6 * 4));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e52d2;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e52d2:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + uVar6 * 8));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e9296;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e9296:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::StringComparisonOperators::GreaterThan
                                       ((string_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (string_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8d96;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8d96:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator>
                                       ((uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e2ea4_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          local_58 = (data_ptr_t)local_b8._0_8_;
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e3815;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e3815:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    uVar3 = ((ulong *)(local_b8._0_8_ + uVar7 * 0x10))[1];
                    if (((long)*(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8) < (long)uVar3) ||
                       (iVar9 = 0,
                       *(ulong *)(local_108._8_8_ + uVar6 * 0x10) <
                       *(ulong *)(local_b8._0_8_ + uVar7 * 0x10) &&
                       uVar3 == *(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8))) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    case COMPARE_LESSTHANOREQUALTO:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e2a0b;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e2a0b:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if ((char)*(data_ptr_t)(local_b8._0_8_ + uVar7) <=
                          (char)*(data_ptr_t)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5fcf;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5fcf:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(byte *)(local_b8._0_8_ + uVar7) <= *(byte *)(local_108._8_8_ + uVar6)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e45bd;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e45bd:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ushort *)(local_b8._0_8_ + uVar7 * 2) <=
                          *(ushort *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e6347;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e6347:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_b8._0_8_ + uVar7 * 2) <=
                          *(short *)(local_108._8_8_ + uVar6 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e58cb;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e58cb:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(uint *)(local_b8._0_8_ + uVar7 * 4) <=
                          *(uint *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5673;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5673:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_b8._0_8_ + uVar7 * 4) <=
                          *(int *)(local_108._8_8_ + uVar6 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e3c29;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e3c29:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ulong *)(local_b8._0_8_ + uVar7 * 8) <=
                          *(ulong *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e621c;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e621c:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_b8._0_8_ + uVar7 * 8) <=
                          *(long *)(local_108._8_8_ + uVar6 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e294c_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e3d4e;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e3d4e:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + uVar6 * 4));
                      iVar9 = 0;
                      if (!bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e40e7;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e40e7:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThan::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + uVar6 * 8));
                      iVar9 = 0;
                      if (!bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e89d6;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e89d6:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::StringComparisonOperators::GreaterThan
                                       ((string_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (string_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8616;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8616:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator>
                                       ((uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e294c_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          local_58 = (data_ptr_t)local_b8._0_8_;
          local_50 = (SelectionVector *)local_108._0_8_;
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e3217;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e3217:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    uVar3 = ((ulong *)(local_b8._0_8_ + uVar7 * 0x10))[1];
                    iVar9 = 0;
                    if (((long)uVar3 <= (long)*(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8)) &&
                       (*(ulong *)(local_b8._0_8_ + uVar7 * 0x10) <=
                        *(ulong *)(local_108._8_8_ + uVar6 * 0x10) ||
                        uVar3 != *(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8))) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    case COMPARE_GREATERTHANOREQUALTO:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e2cb7;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e2cb7:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if ((char)*(data_ptr_t)(local_108._8_8_ + uVar6) <=
                          (char)*(data_ptr_t)(local_b8._0_8_ + uVar7)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7012;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7012:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(byte *)(local_108._8_8_ + uVar6) <= *(byte *)(local_b8._0_8_ + uVar7)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4bb0;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4bb0:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ushort *)(local_108._8_8_ + uVar6 * 2) <=
                          *(ushort *)(local_b8._0_8_ + uVar7 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e7268;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e7268:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(short *)(local_108._8_8_ + uVar6 * 2) <=
                          *(short *)(local_b8._0_8_ + uVar7 * 2)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5ea4;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5ea4:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(uint *)(local_108._8_8_ + uVar6 * 4) <=
                          *(uint *)(local_b8._0_8_ + uVar7 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e5d79;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e5d79:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(int *)(local_108._8_8_ + uVar6 * 4) <=
                          *(int *)(local_b8._0_8_ + uVar7 * 4)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4224;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4224:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(ulong *)(local_108._8_8_ + uVar6 * 8) <=
                          *(ulong *)(local_b8._0_8_ + uVar7 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e713d;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e713d:
                  lVar2 = *(long *)local_108._0_8_;
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (lVar2 != 0) {
                      uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      iVar9 = 0;
                      if (*(long *)(local_108._8_8_ + uVar6 * 8) <=
                          *(long *)(local_b8._0_8_ + uVar7 * 8)) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        default:
switchD_017e2bf8_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4480;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4480:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThanEquals::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + uVar6 * 4));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  if (rcount != 0) goto LAB_017e4811;
                }
                else if ((rcount != 0) &&
                        ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8)
                         ) != 0)) {
LAB_017e4811:
                  uVar13 = 0;
                  do {
                    uVar6 = uVar13;
                    if (*(long *)local_108._0_8_ != 0) {
                      uVar6 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar13 * 4);
                    }
                    if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                       ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >>
                         (uVar6 & 0x3f) & 1) != 0)) {
                      bVar15 = GreaterThanEquals::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + uVar6 * 8));
                      iVar9 = 0;
                      if (bVar15) {
                        found_match[uVar12] = true;
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 7;
                    }
                  } while (((iVar9 == 7) || (iVar9 == 0)) &&
                          (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e9016;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e9016:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = string_t::StringComparisonOperators::GreaterThan
                                       ((string_t *)(local_108._8_8_ + uVar7 * 0x10),
                                        (string_t *)(local_b8._0_8_ + iVar5 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e8896;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)iVar5 & 0x3f) & *(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8))
                       != 0)) {
LAB_017e8896:
                uVar12 = 0;
                do {
                  uVar7 = uVar12;
                  if (*(long *)local_108._0_8_ != 0) {
                    uVar7 = (ulong)*(uint *)(*(long *)local_108._0_8_ + uVar12 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f)
                      & 1) != 0)) {
                    bVar15 = uhugeint_t::operator>
                                       ((uhugeint_t *)(local_108._8_8_ + uVar7 * 0x10),
                                        (uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10));
                    iVar9 = 0;
                    if (!bVar15) {
                      found_match[iVar10] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar12 = uVar12 + 1, rcount + (rcount == 0) != uVar12));
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e2bf8_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          local_58 = (data_ptr_t)local_b8._0_8_;
          uVar12 = 0;
          do {
            if (found_match[uVar12] == false) {
              uVar7 = uVar12;
              if (*(long *)local_c0 != 0) {
                uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                if (rcount != 0) goto LAB_017e350e;
              }
              else if ((rcount != 0) &&
                      ((1L << ((byte)uVar7 & 0x3f) & *(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8))
                       != 0)) {
LAB_017e350e:
                lVar2 = *(long *)local_108._0_8_;
                uVar13 = 0;
                do {
                  uVar6 = uVar13;
                  if (lVar2 != 0) {
                    uVar6 = (ulong)*(uint *)(lVar2 + uVar13 * 4);
                  }
                  if (((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
                     ((*(ulong *)((long)local_f8[0].sel_vector + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f)
                      & 1) != 0)) {
                    uVar3 = ((ulong *)(local_b8._0_8_ + uVar7 * 0x10))[1];
                    iVar9 = 0;
                    if (((long)*(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8) <= (long)uVar3) &&
                       (*(ulong *)(local_108._8_8_ + uVar6 * 0x10) <=
                        *(ulong *)(local_b8._0_8_ + uVar7 * 0x10) ||
                        *(ulong *)(local_108._8_8_ + uVar6 * 0x10 + 8) != uVar3)) {
                      found_match[uVar12] = true;
                      iVar9 = 5;
                    }
                  }
                  else {
                    iVar9 = 7;
                  }
                } while (((iVar9 == 7) || (iVar9 == 0)) &&
                        (uVar13 = uVar13 + 1, rcount + (rcount == 0) != uVar13));
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != lcount);
        }
      }
      break;
    default:
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_c0 = (undefined1  [8])(local_b8 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Unimplemented comparison type for join!","");
      NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case COMPARE_DISTINCT_FROM:
      PVar1 = (left->type).physical_type_;
      if (PVar1 < VARCHAR) {
        switch(PVar1) {
        case BOOL:
        case INT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(data_ptr_t)(local_b8._0_8_ + iVar5) !=
                               *(data_t *)(local_108._8_8_ + iVar11);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case UINT8:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(data_ptr_t)(local_b8._0_8_ + iVar5) !=
                               *(data_t *)(local_108._8_8_ + iVar11);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case UINT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(short *)(local_b8._0_8_ + iVar5 * 2) !=
                               *(short *)(local_108._8_8_ + iVar11 * 2);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case INT16:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(short *)(local_b8._0_8_ + iVar5 * 2) !=
                               *(short *)(local_108._8_8_ + iVar11 * 2);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case UINT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(int *)(local_b8._0_8_ + iVar5 * 4) !=
                               *(int *)(local_108._8_8_ + iVar11 * 4);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case INT32:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(int *)(local_b8._0_8_ + iVar5 * 4) !=
                               *(int *)(local_108._8_8_ + iVar11 * 4);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case UINT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(long *)(local_b8._0_8_ + iVar5 * 8) !=
                               *(long *)(local_108._8_8_ + iVar11 * 8);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        case INT64:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            iVar10 = 0;
            do {
              if (found_match[iVar10] == false) {
                iVar5 = iVar10;
                if (*(long *)local_c0 != 0) {
                  iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar14 = 0;
                  do {
                    iVar11 = iVar14;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                                (iVar11 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = *(long *)(local_b8._0_8_ + iVar5 * 8) !=
                               *(long *)(local_108._8_8_ + iVar11 * 8);
                    }
                    if (bVar16) {
                      found_match[iVar10] = true;
                      break;
                    }
                    iVar14 = iVar14 + 1;
                  } while (rcount != iVar14);
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != lcount);
          }
          break;
        default:
switchD_017e2ffa_caseD_a:
          pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_c0 = (undefined1  [8])(local_b8 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Unimplemented type for mark join!","");
          NotImplementedException::NotImplementedException(pNVar8,(string *)local_c0);
          __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        case FLOAT:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar10 = 0;
                  do {
                    iVar5 = iVar10;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar5 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar10 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar5 >> 6) * 8) >>
                                (iVar5 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = Equals::Operation<float>
                                         ((float *)(local_b8._0_8_ + uVar7 * 4),
                                          (float *)(local_108._8_8_ + iVar5 * 4));
                      bVar16 = !bVar16;
                    }
                    if (bVar16) {
                      found_match[uVar12] = true;
                      break;
                    }
                    iVar10 = iVar10 + 1;
                  } while (rcount != iVar10);
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
          break;
        case DOUBLE:
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
          Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
          if (lcount != 0) {
            uVar12 = 0;
            do {
              if (found_match[uVar12] == false) {
                uVar7 = uVar12;
                if (*(long *)local_c0 != 0) {
                  uVar7 = (ulong)*(uint *)(*(long *)local_c0 + uVar12 * 4);
                }
                if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                  bVar15 = false;
                }
                else {
                  bVar15 = (*(ulong *)(local_b8._8_8_ + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) ==
                           0;
                }
                if (rcount != 0) {
                  iVar10 = 0;
                  do {
                    iVar5 = iVar10;
                    if (*(long *)local_108._0_8_ != 0) {
                      iVar5 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar10 * 4);
                    }
                    if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                      bVar16 = false;
                    }
                    else {
                      bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar5 >> 6) * 8) >>
                                (iVar5 & 0x3f) & 1) == 0;
                    }
                    if ((bool)(bVar15 | bVar16)) {
                      bVar16 = (bool)(bVar16 ^ bVar15);
                    }
                    else {
                      bVar16 = Equals::Operation<double>
                                         ((double *)(local_b8._0_8_ + uVar7 * 8),
                                          (double *)(local_108._8_8_ + iVar5 * 8));
                      bVar16 = !bVar16;
                    }
                    if (bVar16) {
                      found_match[uVar12] = true;
                      break;
                    }
                    iVar10 = iVar10 + 1;
                  } while (rcount != iVar10);
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != lcount);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                bVar15 = false;
              }
              else {
                bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar14 = 0;
                do {
                  iVar11 = iVar14;
                  if (*(long *)local_108._0_8_ != 0) {
                    iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                  }
                  if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                    bVar16 = false;
                  }
                  else {
                    bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                              (iVar11 & 0x3f) & 1) == 0;
                  }
                  if ((bool)(bVar15 | bVar16)) {
                    bVar16 = (bool)(bVar16 ^ bVar15);
                  }
                  else {
                    bVar16 = string_t::operator==
                                       ((string_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (string_t *)(local_108._8_8_ + iVar11 * 0x10));
                    bVar16 = !bVar16;
                  }
                  if (bVar16) {
                    found_match[iVar10] = true;
                    break;
                  }
                  iVar14 = iVar14 + 1;
                } while (rcount != iVar14);
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else if (PVar1 == UINT128) {
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                bVar15 = false;
              }
              else {
                bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar14 = 0;
                do {
                  iVar11 = iVar14;
                  if (*(long *)local_108._0_8_ != 0) {
                    iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                  }
                  if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                    bVar16 = false;
                  }
                  else {
                    bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                              (iVar11 & 0x3f) & 1) == 0;
                  }
                  if ((bool)(bVar15 | bVar16)) {
                    bVar16 = (bool)(bVar16 ^ bVar15);
                  }
                  else {
                    bVar16 = uhugeint_t::operator==
                                       ((uhugeint_t *)(local_b8._0_8_ + iVar5 * 0x10),
                                        (uhugeint_t *)(local_108._8_8_ + iVar11 * 0x10));
                    bVar16 = !bVar16;
                  }
                  if (bVar16) {
                    found_match[iVar10] = true;
                    break;
                  }
                  iVar14 = iVar14 + 1;
                } while (rcount != iVar14);
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_017e2ffa_caseD_a;
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
        Vector::ToUnifiedFormat(left,lcount,(UnifiedVectorFormat *)local_c0);
        Vector::ToUnifiedFormat(right,rcount,(UnifiedVectorFormat *)local_108);
        if (lcount != 0) {
          iVar10 = 0;
          do {
            if (found_match[iVar10] == false) {
              iVar5 = iVar10;
              if (*(long *)local_c0 != 0) {
                iVar5 = (idx_t)*(uint *)(*(long *)local_c0 + iVar10 * 4);
              }
              if ((element_type *)local_b8._8_8_ == (element_type *)0x0) {
                bVar15 = false;
              }
              else {
                bVar15 = (*(ulong *)(local_b8._8_8_ + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) == 0;
              }
              if (rcount != 0) {
                iVar14 = 0;
                do {
                  iVar11 = iVar14;
                  if (*(long *)local_108._0_8_ != 0) {
                    iVar11 = (idx_t)*(uint *)(*(long *)local_108._0_8_ + iVar14 * 4);
                  }
                  if ((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
                    bVar16 = false;
                  }
                  else {
                    bVar16 = (*(ulong *)((long)local_f8[0].sel_vector + (iVar11 >> 6) * 8) >>
                              (iVar11 & 0x3f) & 1) == 0;
                  }
                  if ((bool)(bVar15 | bVar16)) {
                    bVar16 = (bool)(bVar16 ^ bVar15);
                  }
                  else {
                    bVar16 = ((long *)(local_b8._0_8_ + iVar5 * 0x10))[1] !=
                             *(long *)(local_108._8_8_ + iVar11 * 0x10 + 8) ||
                             *(long *)(local_b8._0_8_ + iVar5 * 0x10) !=
                             *(long *)(local_108._8_8_ + iVar11 * 0x10);
                  }
                  if (bVar16) {
                    found_match[iVar10] = true;
                    break;
                  }
                  iVar14 = iVar14 + 1;
                } while (rcount != iVar14);
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != lcount);
        }
      }
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    if (local_f8[0].selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8[0].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    }
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
    }
  }
  return;
}

Assistant:

static void MarkJoinComparisonSwitch(Vector &left, Vector &right, idx_t lcount, idx_t rcount, bool found_match[],
                                     ExpressionType comparison_type) {
	switch (left.GetType().InternalType()) {
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return MarkJoinNested(left, right, lcount, rcount, found_match, comparison_type);
	default:
		break;
	}
	D_ASSERT(left.GetType() == right.GetType());
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
		return MarkJoinSwitch<Equals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_NOTEQUAL:
		return MarkJoinSwitch<NotEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHAN:
		return MarkJoinSwitch<LessThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHAN:
		return MarkJoinSwitch<GreaterThan>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return MarkJoinSwitch<LessThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return MarkJoinSwitch<GreaterThanEquals>(left, right, lcount, rcount, found_match);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return MarkJoinSwitch<DistinctFrom>(left, right, lcount, rcount, found_match);
	default:
		throw NotImplementedException("Unimplemented comparison type for join!");
	}
}